

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void google::protobuf::internal::MapMergeFrom<unsigned_int,proto2_unittest::Proto2MapEnum>
               (Map<unsigned_int,_proto2_unittest::Proto2MapEnum> *dest,
               Map<unsigned_int,_proto2_unittest::Proto2MapEnum> *src)

{
  Proto2MapEnum PVar1;
  Proto2MapEnum *pPVar2;
  const_iterator __begin0;
  UntypedMapIterator local_30;
  
  UntypedMapBase::begin(&local_30,(UntypedMapBase *)src);
  while (local_30.node_ != (NodeBase *)0x0) {
    PVar1 = *(Proto2MapEnum *)((long)&local_30.node_[1].next + 4);
    pPVar2 = Map<unsigned_int,_proto2_unittest::Proto2MapEnum>::operator[]<unsigned_int>
                       (dest,(key_arg<unsigned_int> *)(local_30.node_ + 1));
    *pPVar2 = PVar1;
    UntypedMapIterator::PlusPlus(&local_30);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}